

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O2

mcmodef * mcmoal(mcmcx1def *ctx,mcmon *nump)

{
  ushort uVar1;
  byte bVar2;
  mcmodef *pmVar3;
  
  while( true ) {
    uVar1 = ctx->mcmcxunu;
    if (uVar1 != 0xffff) {
      *nump = uVar1;
      pmVar3 = ctx->mcmcxtab[uVar1 >> 8];
      bVar2 = (byte)uVar1;
      ctx->mcmcxunu = pmVar3[bVar2].mcmonxt;
      pmVar3[bVar2].mcmoloc.mcmolocs = 0xffff;
      return pmVar3 + bVar2;
    }
    uVar1 = ctx->mcmcxpage;
    if (uVar1 == ctx->mcmcxpgmx) break;
    ctx->mcmcxpage = uVar1 + 1;
    pmVar3 = (mcmodef *)mchalo(ctx->mcmcxerr,0x2000,"mcmoal");
    ctx->mcmcxtab[uVar1] = pmVar3;
    mcmadpg(ctx,(uint)uVar1,0xffff);
  }
  *nump = 0xffff;
  return (mcmodef *)0x0;
}

Assistant:

static mcmodef *mcmoal(mcmcx1def *ctx, mcmon *nump)
{
    mcmodef  *ret;
    uint      pagenum;
    
    MCMGLBCTX(ctx);
    
    /* look first in list of unused headers */
startover:
    if (ctx->mcmcxunu != MCMONINV)
    {
        /* we have something in the unused list; return it */
        *nump = ctx->mcmcxunu;
        ret = mcmgobje(ctx, *nump);
        ctx->mcmcxunu = ret->mcmonxt;
        ret->mcmoswh = MCSSEGINV;
        return(ret);
    }
    
    /*
     *   No unused entries: we must create a new page.  To do so, we
     *   simply allocate memory for a new page.  Allocate the memory
     *   ourselves, to avoid deadlocking with the allocator (which can
     *   try to get a new entry to satisfy our request for memory).
     */
    if (ctx->mcmcxpage == ctx->mcmcxpgmx) goto error;      /* no more pages */
    pagenum = ctx->mcmcxpage++;                      /* get a new page slot */
    
    ctx->mcmcxtab[pagenum] =
         (mcmodef *)mchalo(ctx->mcmcxerr, MCMPAGESIZE, "mcmoal");
    mcmadpg(ctx, pagenum, MCMONINV);
    goto startover;

error:
    *nump = MCMONINV;
    return((mcmodef *)0);
}